

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O1

int btbb_decode_payload(btbb_packet *pkt)

{
  uint uVar1;
  
  pkt->payload_header_length = 0;
  switch(pkt->packet_type) {
  case '\0':
  case '\x01':
    pkt->payload_length = 0;
    uVar1 = 1;
    break;
  case '\x02':
    uVar1 = fhs(pkt->clock,pkt);
    break;
  case '\x03':
  case '\b':
  case '\n':
  case '\x0e':
    uVar1 = DM(pkt->clock,pkt);
    break;
  case '\x04':
  case '\t':
  case '\v':
  case '\x0f':
    uVar1 = DH(pkt->clock,pkt);
    break;
  case '\a':
    uVar1 = EV3(pkt->clock,pkt);
    if (1 < uVar1) break;
  case '\x05':
  case '\x06':
    uVar1 = HV(pkt->clock,pkt);
    break;
  case '\f':
    uVar1 = EV4(pkt->clock,pkt);
    break;
  case '\r':
    uVar1 = EV5(pkt->clock,pkt);
    break;
  default:
    uVar1 = 0;
  }
  *(byte *)&pkt->flags = (byte)pkt->flags | 0x80;
  return uVar1;
}

Assistant:

int btbb_decode_payload(btbb_packet* pkt)
{
	int rv = 0;
	pkt->payload_header_length = 0;

	switch(pkt->packet_type)
	{
		case PACKET_TYPE_NULL:
			/* no payload to decode */
			pkt->payload_length = 0;
			rv = 1;
			break;
		case PACKET_TYPE_POLL:
			/* no payload to decode */
			pkt->payload_length = 0;
			rv = 1;
			break;
		case PACKET_TYPE_FHS:
			rv = fhs(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DM1:
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DH1:
			/* assuming DH1 but could be 2-DH1 */
			rv = DH(pkt->clock, pkt);
			break;
		case PACKET_TYPE_HV1:
			rv = HV(pkt->clock, pkt);
			break;
		case PACKET_TYPE_HV2:
			rv = HV(pkt->clock, pkt);
			break;
		case PACKET_TYPE_HV3: /* HV3/EV3/3-EV3 */
			/* decode as EV3 if CRC checks out */
			if ((rv = EV3(pkt->clock, pkt)) <= 1)
				/* otherwise assume HV3 */
				rv = HV(pkt->clock, pkt);
			/* don't know how to decode 3-EV3 */
			break;
		case PACKET_TYPE_DV:
			/* assuming DV but could be 3-DH1 */
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_AUX1:
			rv = DH(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DM3:
			/* assuming DM3 but could be 2-DH3 */
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DH3:
			/* assuming DH3 but could be 3-DH3 */
			rv = DH(pkt->clock, pkt);
			break;
		case PACKET_TYPE_EV4:
			/* assuming EV4 but could be 2-EV5 */
			rv = EV4(pkt->clock, pkt);
			break;
		case PACKET_TYPE_EV5:
			/* assuming EV5 but could be 3-EV5 */
			rv = EV5(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DM5:
			/* assuming DM5 but could be 2-DH5 */
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DH5:
			/* assuming DH5 but could be 3-DH5 */
			rv = DH(pkt->clock, pkt);
			break;
	}
	btbb_packet_set_flag(pkt, BTBB_HAS_PAYLOAD, 1);
	return rv;
}